

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

VkPipelineShaderStageCreateInfo * __thiscall
vkt::BindingModel::anon_unknown_1::RenderInstanceShaders::getShaderStageCreateInfo
          (VkPipelineShaderStageCreateInfo *__return_storage_ptr__,RenderInstanceShaders *this,
          VkShaderStageFlagBits stage,VkShaderModule shader)

{
  VkShaderStageFlagBits stage_local;
  RenderInstanceShaders *this_local;
  VkShaderModule shader_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->stage = stage;
  (__return_storage_ptr__->module).m_internal = shader.m_internal;
  __return_storage_ptr__->pName = "main";
  __return_storage_ptr__->pSpecializationInfo = (VkSpecializationInfo *)0x0;
  return __return_storage_ptr__;
}

Assistant:

vk::VkPipelineShaderStageCreateInfo RenderInstanceShaders::getShaderStageCreateInfo (vk::VkShaderStageFlagBits stage, vk::VkShaderModule shader) const
{
	const vk::VkPipelineShaderStageCreateInfo	stageCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
		DE_NULL,
		(vk::VkPipelineShaderStageCreateFlags)0,
		stage,			// stage
		shader,			// shader
		"main",
		DE_NULL,		// pSpecializationInfo
	};
	return stageCreateInfo;
}